

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeOffset(Vdbe *v,Select *p,int iContinue)

{
  uint uVar1;
  
  if (iContinue != 0 && p->iOffset != 0) {
    sqlite3VdbeAddOp2(v,0x14,p->iOffset,-1);
    uVar1 = sqlite3VdbeAddOp1(v,0x79,p->iOffset);
    sqlite3VdbeAddOp2(v,1,0,iContinue);
    if ((-1 < (int)uVar1) && (uVar1 < (uint)v->nOp)) {
      v->aOp[uVar1].p2 = v->nOp;
    }
  }
  return;
}

Assistant:

static void codeOffset(
  Vdbe *v,          /* Generate code into this VM */
  Select *p,        /* The SELECT statement being coded */
  int iContinue     /* Jump here to skip the current record */
){
  if( p->iOffset && iContinue!=0 ){
    int addr;
    sqlite3VdbeAddOp2(v, OP_AddImm, p->iOffset, -1);
    addr = sqlite3VdbeAddOp1(v, OP_IfNeg, p->iOffset);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, iContinue);
    VdbeComment((v, "skip OFFSET records"));
    sqlite3VdbeJumpHere(v, addr);
  }
}